

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapQuaternion.cpp
# Opt level: O2

bool mnf::ExpMapQuaternion::isInM_(VectorXd *val,double prec)

{
  long lVar1;
  ConstReverseQuaternion local_38;
  
  lVar1 = (val->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  utils::ConstReverseQuaternion::ConstReverseQuaternion
            (&local_38,
             (val->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data)
  ;
  return ABS(SQRT(local_38.super_Quaterniond.m_coeffs.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array[3] *
                  local_38.super_Quaterniond.m_coeffs.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array[3] +
                  local_38.super_Quaterniond.m_coeffs.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array[1] *
                  local_38.super_Quaterniond.m_coeffs.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array[1] +
                  local_38.super_Quaterniond.m_coeffs.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array[2] *
                  local_38.super_Quaterniond.m_coeffs.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array[2] +
                  local_38.super_Quaterniond.m_coeffs.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array[0] *
                  local_38.super_Quaterniond.m_coeffs.
                  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                  array[0]) + -1.0) < prec && lVar1 == 4;
}

Assistant:

bool ExpMapQuaternion::isInM_(const Eigen::VectorXd& val, double prec)
{
  bool out(val.size() == 4);
  double norm = toConstQuat(val.data()).norm();
  out = out && (fabs(norm - 1) < prec);
  return out;
}